

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testNNValidatorLoop(void)

{
  pointer pcVar1;
  int iVar2;
  ConvolutionLayerParams *pCVar3;
  bool bVar4;
  ModelDescription *pMVar5;
  Type *pTVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  TypeUnion this;
  Type *this_00;
  InnerProductLayerParams *pIVar9;
  Type *this_01;
  Type *this_02;
  ostream *poVar10;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_03;
  Result res;
  Model m1;
  undefined1 local_80 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Model local_58;
  
  CoreML::Specification::Model::Model(&local_58);
  if (local_58.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_58.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_58.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_80 + 0x10;
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"A","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  iVar2 = (pAVar8->shape_).total_size_;
  if ((pAVar8->shape_).current_size_ == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar8->shape_,iVar2 + 1);
  }
  iVar2 = (pAVar8->shape_).current_size_;
  (pAVar8->shape_).current_size_ = iVar2 + 1;
  ((pAVar8->shape_).rep_)->elements[iVar2] = 1;
  if (local_58.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_58.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_58.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"B","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  if (local_58._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_58);
    local_58._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_58.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  this_03 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_58.Type_.pipeline_)->models_;
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)this_03,(Type *)0x0);
  if (this_00->_oneof_case_[0] != 0x8c) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x8c;
    pIVar9 = (InnerProductLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(pIVar9);
    (this_00->layer_).innerproduct_ = pIVar9;
  }
  pCVar3 = (this_00->layer_).convolution_;
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"ip1","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_00->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  *(undefined1 *)&(pCVar3->stride_).rep_ = 0;
  this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)this_03,(Type *)0x0);
  if (this_01->_oneof_case_[0] != 0x8c) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_01);
    this_01->_oneof_case_[0] = 0x8c;
    pIVar9 = (InnerProductLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(pIVar9);
    (this_01->layer_).innerproduct_ = pIVar9;
  }
  *(undefined1 *)&(((this_01->layer_).convolution_)->stride_).rep_ = 0;
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"ip2","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_01->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  this_02 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)this_03,(Type *)0x0);
  if (this_02->_oneof_case_[0] != 0x8c) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_02);
    this_02->_oneof_case_[0] = 0x8c;
    pIVar9 = (InnerProductLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(pIVar9);
    (this_02->layer_).innerproduct_ = pIVar9;
  }
  *(undefined1 *)&(((this_02->layer_).convolution_)->stride_).rep_ = 0;
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"ip3","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_02->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"B");
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"B");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"C");
  CoreML::Specification::NeuralNetworkLayer::add_input(this_02,"C");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_02,"A");
  CoreML::validate<(MLModelType)500>((Result *)local_80,&local_58);
  bVar4 = CoreML::Result::good((Result *)local_80);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x229);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._8_8_ != &local_68) {
    operator_delete((void *)local_80._8_8_,local_68._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_58);
  return (uint)bVar4;
}

Assistant:

int testNNValidatorLoop() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();

    auto *nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *ip1 = nn->add_layers();
    Specification::InnerProductLayerParams *innerProductParams1 = ip1->mutable_innerproduct();
    ip1->set_name("ip1");

    innerProductParams1->set_hasbias(false);

    Specification::NeuralNetworkLayer *ip2 = nn->add_layers();
    Specification::InnerProductLayerParams *innerProductParams2 = ip2->mutable_innerproduct();

    innerProductParams2->set_hasbias(false);

    ip2->set_name("ip2");

    Specification::NeuralNetworkLayer *ip3 = nn->add_layers();
    Specification::InnerProductLayerParams *innerProductParams3 = ip3->mutable_innerproduct();

    innerProductParams3->set_hasbias(false);
    ip3->set_name("ip3");

    // Make a loop

    ip1->add_input("A");
    ip1->add_output("B");

    ip2->add_input("B");
    ip2->add_output("C");

    ip3->add_input("C");
    ip3->add_output("A");

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);

    return 0;
}